

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::ICUTransService::compareNIString
          (ICUTransService *this,XMLCh *comp1,XMLCh *comp2,XMLSize_t maxChars)

{
  XMLSize_t XVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  UChar32 folded2;
  UChar32 folded1;
  UChar32 ch2;
  UChar32 ch1;
  size_t j;
  size_t i;
  XMLSize_t maxChars_local;
  XMLCh *comp2_local;
  XMLCh *comp1_local;
  ICUTransService *this_local;
  
  if (maxChars == 0) {
    this_local._4_4_ = 0;
  }
  else {
    j = 0;
    _ch2 = 0;
    do {
      folded1 = (UChar32)(ushort)comp1[j];
      sVar2 = j + 1;
      if ((folded1 & 0xfffffc00U) == 0xd800) {
        folded1 = folded1 * 0x400 + (uint)(ushort)comp1[j + 1] + -0x35fdc00;
        sVar2 = j + 2;
      }
      j = sVar2;
      folded2 = (UChar32)(ushort)comp2[_ch2];
      XVar1 = _ch2 + 1;
      if ((folded2 & 0xfffffc00U) == 0xd800) {
        folded2 = folded2 * 0x400 + (uint)(ushort)comp2[_ch2 + 1] + -0x35fdc00;
        XVar1 = _ch2 + 2;
      }
      _ch2 = XVar1;
      iVar3 = u_foldCase_70(folded1,0);
      iVar4 = u_foldCase_70(folded2);
      if (iVar3 != iVar4) {
        return iVar3 - iVar4;
      }
      if (j == maxChars) {
        if (_ch2 != maxChars) {
          return -1;
        }
        return 0;
      }
    } while (_ch2 != maxChars);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int ICUTransService::compareNIString(const  XMLCh* const    comp1
                                    , const XMLCh* const    comp2
                                    , const XMLSize_t       maxChars)
{
    if (maxChars > 0)
    {
        // Note that this function has somewhat broken semantics, as it's
        // possible for two strings of different lengths to compare as equal
        // in a case-insensitive manner, since one character could be
        // represented as a surrogate pair.
        size_t  i = 0;
        size_t  j = 0;

        for(;;)
        {
            UChar32 ch1;
            UChar32 ch2;

            U16_NEXT_UNSAFE(comp1, i, ch1);
            U16_NEXT_UNSAFE(comp2, j, ch2);

            const UChar32   folded1 =
                u_foldCase(ch1, U_FOLD_CASE_DEFAULT);

            const UChar32   folded2 =
                u_foldCase(ch2, U_FOLD_CASE_DEFAULT);

            if (folded1 != folded2)
            {
                return folded1 - folded2;
            }
            else if (i == maxChars)
            {
                // If we're at the end of both strings, return 0.
                // Otherwise, we've run out of characters in the
                // left string, so return -1.
                return j == maxChars ? 0 : -1;
            }
            else if (j == maxChars)
            {
                // We've run out of characters in the right string,
                // but not the left, so return 1.
                return 1;
            }
        }
    }

    return 0;
}